

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::PairMatcherImpl<std::pair<std::__cxx11::string,std::__cxx11::string>const&>::
PairMatcherImpl<char_const*,char_const*>
          (PairMatcherImpl<std::pair<std::__cxx11::string,std::__cxx11::string>const&> *this,
          char *first_matcher,char *second_matcher)

{
  char **polymorphic_matcher_or_value;
  char **polymorphic_matcher_or_value_00;
  char *local_20;
  char *second_matcher_local;
  char *first_matcher_local;
  PairMatcherImpl<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  *this_local;
  
  local_20 = second_matcher;
  second_matcher_local = first_matcher;
  first_matcher_local = (char *)this;
  MatcherInterface<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
  ::MatcherInterface((MatcherInterface<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
                      *)this);
  *(undefined ***)this = &PTR__PairMatcherImpl_002904e0;
  SafeMatcherCast<std::__cxx11::string_const&,char_const*>
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)(this + 8),(testing *)&second_matcher_local,polymorphic_matcher_or_value);
  SafeMatcherCast<std::__cxx11::string_const&,char_const*>
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)(this + 0x20),(testing *)&local_20,polymorphic_matcher_or_value_00);
  return;
}

Assistant:

PairMatcherImpl(FirstMatcher first_matcher, SecondMatcher second_matcher)
      : first_matcher_(
            testing::SafeMatcherCast<const FirstType&>(first_matcher)),
        second_matcher_(
            testing::SafeMatcherCast<const SecondType&>(second_matcher)) {}